

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_psrlq_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  int shift;
  MMXReg *s_local;
  MMXReg *d_local;
  CPUX86State *env_local;
  
  if (s->_q_MMXReg[0] < 0x40) {
    d->_q_MMXReg[0] = d->_q_MMXReg[0] >> (s->_b_MMXReg[0] & 0x3f);
  }
  else {
    d->_q_MMXReg[0] = 0;
  }
  return;
}

Assistant:

void glue(helper_psrlq, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift;

    if (s->Q(0) > 63) {
        d->Q(0) = 0;
#if SHIFT == 1
        d->Q(1) = 0;
#endif
    } else {
        shift = s->B(0);
        d->Q(0) >>= shift;
#if SHIFT == 1
        d->Q(1) >>= shift;
#endif
    }
}